

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O2

lzma_ret lz_encode(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                  size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,lzma_action action)

{
  lzma_ret lVar1;
  int iVar2;
  char *__function;
  uint uVar3;
  uint uVar4;
  char *__assertion;
  uint uVar5;
  ulong local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  lzma_allocator *local_38;
  
  local_40 = in;
  local_38 = allocator;
  do {
    if (out_size <= *out_pos) {
      return LZMA_OK;
    }
    if ((action == LZMA_RUN) && (in_size <= *in_pos)) {
      return LZMA_OK;
    }
    if ((*(int *)((long)coder_ptr + 0x88) == 0) &&
       (uVar3 = *(uint *)((long)coder_ptr + 0x38), *(uint *)((long)coder_ptr + 0x40) <= uVar3)) {
      uVar4 = *(uint *)((long)coder_ptr + 0x44);
      if (uVar4 < uVar3) {
        __assertion = "coder->mf.read_pos <= coder->mf.write_pos";
        __function = 
        "lzma_ret fill_window(lzma_coder *, const lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
        ;
        uVar3 = 0x55;
        goto LAB_0039835f;
      }
      if (*(uint *)((long)coder_ptr + 0x28) - *(int *)((long)coder_ptr + 0x30) <= uVar3) {
        uVar5 = uVar3 - *(uint *)((long)coder_ptr + 0x2c);
        if (uVar3 < *(uint *)((long)coder_ptr + 0x2c) || uVar5 == 0) {
          __assertion = "mf->read_pos > mf->keep_size_before";
          __function = "void move_window(lzma_mf *)";
          uVar3 = 0x34;
          goto LAB_0039835f;
        }
        uVar5 = uVar5 & 0xfffffff0;
        uVar3 = uVar4 - uVar5;
        if (uVar4 < uVar5 || uVar3 == 0) {
          __assertion = "mf->write_pos > move_offset";
          __function = "void move_window(lzma_mf *)";
          uVar3 = 0x38;
          goto LAB_0039835f;
        }
        if ((ulong)*(uint *)((long)coder_ptr + 0x28) < (ulong)uVar3 + (ulong)uVar5) {
          __assertion = "move_offset + move_size <= mf->size";
          __function = "void move_window(lzma_mf *)";
          uVar3 = 0x3b;
          goto LAB_0039835f;
        }
        memmove(*(void **)((long)coder_ptr + 0x20),
                (void *)((ulong)uVar5 + (long)*(void **)((long)coder_ptr + 0x20)),(ulong)uVar3);
        *(int *)((long)coder_ptr + 0x34) = *(int *)((long)coder_ptr + 0x34) + uVar5;
        *(int *)((long)coder_ptr + 0x38) = *(int *)((long)coder_ptr + 0x38) - uVar5;
        *(int *)((long)coder_ptr + 0x40) = *(int *)((long)coder_ptr + 0x40) - uVar5;
        uVar4 = *(int *)((long)coder_ptr + 0x44) - uVar5;
        *(uint *)((long)coder_ptr + 0x44) = uVar4;
      }
      local_50 = (ulong)uVar4;
      if (*(code **)((long)coder_ptr + 0xb0) == (code *)0x0) {
        local_48 = out;
        lzma_bufcpy(local_40,in_pos,in_size,*(uint8_t **)((long)coder_ptr + 0x20),&local_50,
                    (ulong)*(uint *)((long)coder_ptr + 0x28));
        out = local_48;
        if (action == LZMA_RUN) {
          lVar1 = LZMA_OK;
        }
        else {
          lVar1 = (lzma_ret)(*in_pos == in_size);
        }
      }
      else {
        lVar1 = (**(code **)((long)coder_ptr + 0xb0))
                          (*(undefined8 *)((long)coder_ptr + 0x98),local_38,local_40,in_pos,in_size,
                           *(undefined8 *)((long)coder_ptr + 0x20),&local_50,
                           *(undefined4 *)((long)coder_ptr + 0x28),action);
      }
      *(int *)((long)coder_ptr + 0x44) = (int)local_50;
      *(undefined8 *)(*(long *)((long)coder_ptr + 0x20) + local_50) = 0;
      if (lVar1 == LZMA_STREAM_END) {
        if (*in_pos != in_size) {
          __assertion = "*in_pos == in_size";
          __function = 
          "lzma_ret fill_window(lzma_coder *, const lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
          ;
          uVar3 = 0x7c;
LAB_0039835f:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,uVar3,__function);
        }
        *(lzma_action *)((long)coder_ptr + 0x88) = action;
        iVar2 = *(int *)((long)coder_ptr + 0x44);
        lVar1 = LZMA_OK;
LAB_0039826f:
        *(int *)((long)coder_ptr + 0x40) = iVar2;
      }
      else {
        iVar2 = *(uint *)((long)coder_ptr + 0x44) - *(uint *)((long)coder_ptr + 0x30);
        if (*(uint *)((long)coder_ptr + 0x30) <= *(uint *)((long)coder_ptr + 0x44) && iVar2 != 0)
        goto LAB_0039826f;
      }
      uVar3 = *(uint *)((long)coder_ptr + 0x48);
      if ((uVar3 != 0) &&
         (uVar4 = *(uint *)((long)coder_ptr + 0x38), uVar4 < *(uint *)((long)coder_ptr + 0x40))) {
        *(undefined4 *)((long)coder_ptr + 0x48) = 0;
        if (uVar4 < uVar3) {
          __assert_fail("coder->mf.read_pos >= pending",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                        ,0x93,
                        "lzma_ret fill_window(lzma_coder *, const lzma_allocator *, const uint8_t *, size_t *, size_t, lzma_action)"
                       );
        }
        *(uint *)((long)coder_ptr + 0x38) = uVar4 - uVar3;
        (**(code **)((long)coder_ptr + 0x58))((long)coder_ptr + 0x20);
      }
      if (lVar1 != LZMA_OK) {
        return lVar1;
      }
    }
    lVar1 = (**(code **)((long)coder_ptr + 8))
                      (*coder_ptr,(long)coder_ptr + 0x20,out,out_pos,out_size);
    if (lVar1 != LZMA_OK) {
      *(undefined4 *)((long)coder_ptr + 0x88) = 0;
      return lVar1;
    }
  } while( true );
}

Assistant:

static lzma_ret
lz_encode(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size,
		uint8_t *restrict out, size_t *restrict out_pos,
		size_t out_size, lzma_action action)
{
	lzma_coder *coder = coder_ptr;

	while (*out_pos < out_size
			&& (*in_pos < in_size || action != LZMA_RUN)) {
		// Read more data to coder->mf.buffer if needed.
		if (coder->mf.action == LZMA_RUN && coder->mf.read_pos
				>= coder->mf.read_limit)
			return_if_error(fill_window(coder, allocator,
					in, in_pos, in_size, action));

		// Encode
		const lzma_ret ret = coder->lz.code(coder->lz.coder,
				&coder->mf, out, out_pos, out_size);
		if (ret != LZMA_OK) {
			// Setting this to LZMA_RUN for cases when we are
			// flushing. It doesn't matter when finishing or if
			// an error occurred.
			coder->mf.action = LZMA_RUN;
			return ret;
		}
	}

	return LZMA_OK;
}